

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int evp_keyex_exchange(ptls_key_exchange_algorithm_t *algo,ptls_iovec_t *outpubkey,
                      ptls_iovec_t *secret,ptls_iovec_t peerkey)

{
  uint8_t *puVar1;
  ptls_iovec_t pVar2;
  int local_3c;
  ptls_key_exchange_context_t *ppStack_38;
  int ret;
  ptls_key_exchange_context_t *ctx;
  ptls_iovec_t *secret_local;
  ptls_iovec_t *outpubkey_local;
  ptls_key_exchange_algorithm_t *algo_local;
  ptls_iovec_t peerkey_local;
  
  peerkey_local.base = (uint8_t *)peerkey.len;
  algo_local = (ptls_key_exchange_algorithm_t *)peerkey.base;
  ppStack_38 = (ptls_key_exchange_context_t *)0x0;
  outpubkey->base = (uint8_t *)0x0;
  ctx = (ptls_key_exchange_context_t *)secret;
  secret_local = outpubkey;
  outpubkey_local = (ptls_iovec_t *)algo;
  local_3c = evp_keyex_create(algo,&stack0xffffffffffffffc8);
  if (local_3c == 0) {
    puVar1 = (uint8_t *)malloc((ppStack_38->pubkey).len);
    secret_local->base = puVar1;
    if (puVar1 == (uint8_t *)0x0) {
      local_3c = 0x201;
    }
    else {
      memcpy(secret_local->base,(ppStack_38->pubkey).base,(ppStack_38->pubkey).len);
      secret_local->len = (ppStack_38->pubkey).len;
      pVar2.len = (size_t)peerkey_local.base;
      pVar2.base = (uint8_t *)algo_local;
      local_3c = evp_keyex_on_exchange(&stack0xffffffffffffffc8,1,(ptls_iovec_t *)ctx,pVar2);
      if (ppStack_38 != (ptls_key_exchange_context_t *)0x0) {
        __assert_fail("ctx == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/openssl.c"
                      ,0x295,
                      "int evp_keyex_exchange(ptls_key_exchange_algorithm_t *, ptls_iovec_t *, ptls_iovec_t *, ptls_iovec_t)"
                     );
      }
    }
  }
  if (ppStack_38 != (ptls_key_exchange_context_t *)0x0) {
    pVar2 = ptls_iovec_init((void *)0x0,0);
    evp_keyex_on_exchange(&stack0xffffffffffffffc8,1,(ptls_iovec_t *)0x0,pVar2);
  }
  if (local_3c != 0) {
    free(secret_local->base);
  }
  return local_3c;
}

Assistant:

static int evp_keyex_exchange(ptls_key_exchange_algorithm_t *algo, ptls_iovec_t *outpubkey, ptls_iovec_t *secret,
                              ptls_iovec_t peerkey)
{
    ptls_key_exchange_context_t *ctx = NULL;
    int ret;

    outpubkey->base = NULL;

    if ((ret = evp_keyex_create(algo, &ctx)) != 0)
        goto Exit;
    if ((outpubkey->base = malloc(ctx->pubkey.len)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    memcpy(outpubkey->base, ctx->pubkey.base, ctx->pubkey.len);
    outpubkey->len = ctx->pubkey.len;
    ret = evp_keyex_on_exchange(&ctx, 1, secret, peerkey);
    assert(ctx == NULL);

Exit:
    if (ctx != NULL)
        evp_keyex_on_exchange(&ctx, 1, NULL, ptls_iovec_init(NULL, 0));
    if (ret != 0)
        free(outpubkey->base);
    return ret;
}